

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls.c
# Opt level: O2

_Bool ECDSA_Verify(COSE *pSigner,int index,eckey_t *eckey,int cbitDigest,byte *rgbToSign,
                  size_t cbToSign,cose_errback *perr)

{
  mbedtls_md_type_t md_type;
  cose_error cVar1;
  byte bVar2;
  int iVar3;
  mbedtls_md_info_t *md_info;
  cn_cbor *pcVar4;
  size_t buflen;
  _Bool _Var5;
  mbedtls_mpi s;
  mbedtls_mpi r;
  byte rgbDigest [32];
  
  mbedtls_mpi_init(&r);
  mbedtls_mpi_init(&s);
  if (cbitDigest == 0x100) {
    md_type = MBEDTLS_MD_SHA256;
LAB_001c2eff:
    md_info = mbedtls_md_info_from_type(md_type);
    if (md_info == (mbedtls_md_info_t *)0x0) goto LAB_001c2f24;
    iVar3 = mbedtls_md(md_info,rgbToSign,cbToSign,rgbDigest);
    if (iVar3 != 0) goto LAB_001c2f24;
    pcVar4 = _COSE_arrayget_int(pSigner,index);
    if ((pcVar4 == (cn_cbor *)0x0) || (pcVar4->type != CN_CBOR_BYTES)) goto LAB_001c2f24;
    iVar3 = mbedtls_mpi_read_binary(&r,(pcVar4->v).bytes,(long)(pcVar4->length / 2));
    if (iVar3 != 0) {
LAB_001c2fae:
      if (perr == (cose_errback *)0x0) goto LAB_001c2f36;
      cVar1 = COSE_ERR_OUT_OF_MEMORY;
      goto LAB_001c2f33;
    }
    buflen = (size_t)(pcVar4->length / 2);
    iVar3 = mbedtls_mpi_read_binary(&s,(pcVar4->v).bytes + buflen,buflen);
    if (iVar3 != 0) goto LAB_001c2fae;
    bVar2 = mbedtls_md_get_size(md_info);
    iVar3 = mbedtls_ecdsa_verify(&eckey->grp,rgbDigest,(ulong)bVar2,&eckey->Q,&r,&s);
    if (iVar3 == 0) {
      _Var5 = true;
      goto LAB_001c2f38;
    }
    if (perr != (cose_errback *)0x0) {
      cVar1 = COSE_ERR_CRYPTO_FAIL;
      goto LAB_001c2f33;
    }
  }
  else {
    if (cbitDigest == 0x200) {
      md_type = MBEDTLS_MD_SHA512;
      goto LAB_001c2eff;
    }
    if (cbitDigest == 0x180) {
      md_type = MBEDTLS_MD_SHA384;
      goto LAB_001c2eff;
    }
LAB_001c2f24:
    if (perr != (cose_errback *)0x0) {
      cVar1 = COSE_ERR_INVALID_PARAMETER;
LAB_001c2f33:
      perr->err = cVar1;
    }
  }
LAB_001c2f36:
  _Var5 = false;
LAB_001c2f38:
  mbedtls_mpi_free(&r);
  mbedtls_mpi_free(&s);
  return _Var5;
}

Assistant:

bool ECDSA_Verify(COSE * pSigner, int index, const eckey_t * eckey, int cbitDigest, const byte * rgbToSign, size_t cbToSign, cose_errback * perr)
{
	mbedtls_mpi r;
	mbedtls_mpi s;
	mbedtls_md_type_t mdType;
	const mbedtls_md_info_t *pmdInfo;
	byte rgbDigest[MBEDTLS_MD_MAX_SIZE];
	cn_cbor * pSig;
	bool result = false;

	mbedtls_mpi_init(&r);
	mbedtls_mpi_init(&s);

	switch(cbitDigest)
	{
	case 256:
		mdType = MBEDTLS_MD_SHA256;
		break;

	case 384:
		mdType = MBEDTLS_MD_SHA384;
		break;

	case 512:
		mdType = MBEDTLS_MD_SHA512;
		break;

	default:
		FAIL_CONDITION(COSE_ERR_INVALID_PARAMETER);
	}
	pmdInfo = mbedtls_md_info_from_type(mdType);
	CHECK_CONDITION(pmdInfo != NULL, COSE_ERR_INVALID_PARAMETER);
	CHECK_CONDITION(mbedtls_md(pmdInfo, rgbToSign, cbToSign, rgbDigest) == 0, COSE_ERR_INVALID_PARAMETER);

	pSig = _COSE_arrayget_int(pSigner, index);
	CHECK_CONDITION((pSig != NULL) && (pSig->type == CN_CBOR_BYTES), COSE_ERR_INVALID_PARAMETER);

	CHECK_CONDITION(mbedtls_mpi_read_binary( &r, pSig->v.bytes, pSig->length / 2 ) == 0, COSE_ERR_OUT_OF_MEMORY);
	CHECK_CONDITION(mbedtls_mpi_read_binary( &s, pSig->v.bytes + pSig->length / 2, pSig->length / 2 ) == 0, COSE_ERR_OUT_OF_MEMORY);
	CHECK_CONDITION(mbedtls_ecdsa_verify((mbedtls_ecp_group*)&eckey->grp, rgbDigest, mbedtls_md_get_size(pmdInfo), &eckey->Q, &r, &s) == 0, COSE_ERR_CRYPTO_FAIL);

	result = true;

errorReturn:
	mbedtls_mpi_free(&r);
	mbedtls_mpi_free(&s);
	return result;
}